

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_map.c
# Opt level: O0

char addEntry(Entry *entries,uint32_t capacity,Value key,Value value)

{
  char cVar1;
  Value b;
  Value value_00;
  Value a;
  uint local_40;
  uint32_t index;
  uint32_t capacity_local;
  Entry *entries_local;
  Value value_local;
  Value key_local;
  
  b.field_1 = key.field_1;
  b.type = key.type;
  value_00._4_4_ = 0;
  value_00.type = b.type;
  value_00.field_1.objHeader = b.field_1.objHeader;
  local_40 = hashValue(value_00);
  while( true ) {
    local_40 = local_40 % capacity;
    if (entries[local_40].key.type == VT_UNDEFINED) {
      *(ulong *)&entries[local_40].key = CONCAT44(value_local.field_1._4_4_,b.type);
      entries[local_40].key.field_1.objHeader = (ObjHeader *)b.field_1;
      *(ulong *)&entries[local_40].value = CONCAT44(entries_local._4_4_,value.type);
      entries[local_40].value.field_1 = value.field_1;
      return '\x01';
    }
    a._4_4_ = 0;
    a.type = entries[local_40].key.type;
    b._4_4_ = 0;
    a.field_1.objHeader = entries[local_40].key.field_1.objHeader;
    cVar1 = valueIsEqual(a,b);
    if (cVar1 != '\0') break;
    local_40 = local_40 + 1;
  }
  *(ulong *)&entries[local_40].value = CONCAT44(entries_local._4_4_,value.type);
  entries[local_40].value.field_1 = value.field_1;
  return '\0';
}

Assistant:

static bool addEntry(Entry *entries, uint32_t capacity, Value key, Value value) {
    uint32_t index = hashValue(key) % capacity;

    //通过开放探测法去找可用的slot
    while (true) {
        //找到空闲的slot,说明目前没有此key,直接赋值返回
        if (entries[index].key.type == VT_UNDEFINED) {
            entries[index].key = key;
            entries[index].value = value;
            return true;       //新的key就返回true
        } else if (valueIsEqual(entries[index].key, key)) { //key已经存在,仅仅更新值就行
            entries[index].value = value;
            return false;    // 未增加新的key就返回false
        }

        //开放探测定址,尝试下一个slot
        index = (index + 1) % capacity;
    }
}